

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

ImVec2 InputTextCalcTextSizeW
                 (ImWchar *text_begin,ImWchar *text_end,ImWchar **remaining,ImVec2 *out_offset,
                 bool stop_on_new_line)

{
  float fVar1;
  ushort uVar2;
  ImFont *pIVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float *pfVar6;
  ImVec2 IVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [64];
  
  pIVar3 = GImGui->Font;
  fVar1 = GImGui->FontSize;
  auVar8 = ZEXT816(0) << 0x40;
  do {
    auVar10 = ZEXT1664(ZEXT816(0) << 0x40);
    while( true ) {
      do {
        auVar9 = auVar10._0_16_;
        if (text_end <= text_begin) goto LAB_00173449;
        uVar2 = *text_begin;
        text_begin = text_begin + 1;
      } while (uVar2 == 0xd);
      if (uVar2 == 10) break;
      pfVar6 = (float *)((ulong)((uint)uVar2 * 4) + (long)(pIVar3->IndexAdvanceX).Data);
      if ((pIVar3->IndexAdvanceX).Size <= (int)(uint)uVar2) {
        pfVar6 = &pIVar3->FallbackAdvanceX;
      }
      auVar10 = ZEXT464((uint)(auVar10._0_4_ + (fVar1 / pIVar3->FontSize) * *pfVar6));
    }
    auVar4 = vcmpss_avx(auVar9,auVar8,2);
    auVar9 = vblendvps_avx(auVar9,auVar8,auVar4);
    auVar8 = vmovshdup_avx(auVar8);
    auVar8 = vinsertps_avx(auVar9,ZEXT416((uint)(fVar1 + auVar8._0_4_)),0x1c);
  } while ((char)out_offset == '\0');
  auVar9 = ZEXT816(0) << 0x20;
LAB_00173449:
  if (remaining != (ImWchar **)0x0) {
    *remaining = text_begin;
  }
  if (auVar8._0_4_ < auVar9._0_4_) {
    auVar8._0_4_ = auVar9._0_4_;
  }
  IVar7 = auVar8._0_8_;
  auVar5 = vmovshdup_avx(auVar8);
  auVar4 = vcmpps_avx(auVar5,ZEXT816(0) << 0x40,0);
  auVar9 = vcmpps_avx(ZEXT816(0) << 0x40,auVar9,1);
  auVar9 = vorps_avx(auVar9,auVar4);
  if ((auVar9 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    auVar8 = vinsertps_avx(auVar8,ZEXT416((uint)(fVar1 + auVar5._0_4_)),0x10);
    IVar7 = auVar8._0_8_;
  }
  return IVar7;
}

Assistant:

static ImVec2 InputTextCalcTextSizeW(const ImWchar* text_begin, const ImWchar* text_end, const ImWchar** remaining, ImVec2* out_offset, bool stop_on_new_line)
{
    ImGuiContext& g = *GImGui;
    ImFont* font = g.Font;
    const float line_height = g.FontSize;
    const float scale = line_height / font->FontSize;

    ImVec2 text_size = ImVec2(0, 0);
    float line_width = 0.0f;

    const ImWchar* s = text_begin;
    while (s < text_end)
    {
        unsigned int c = (unsigned int)(*s++);
        if (c == '\n')
        {
            text_size.x = ImMax(text_size.x, line_width);
            text_size.y += line_height;
            line_width = 0.0f;
            if (stop_on_new_line)
                break;
            continue;
        }
        if (c == '\r')
            continue;

        const float char_width = font->GetCharAdvance((ImWchar)c) * scale;
        line_width += char_width;
    }

    if (text_size.x < line_width)
        text_size.x = line_width;

    if (out_offset)
        *out_offset = ImVec2(line_width, text_size.y + line_height);  // offset allow for the possibility of sitting after a trailing \n

    if (line_width > 0 || text_size.y == 0.0f)                        // whereas size.y will ignore the trailing \n
        text_size.y += line_height;

    if (remaining)
        *remaining = s;

    return text_size;
}